

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDefinitions.cxx
# Opt level: O0

bool cmDefinitions::HasKey(string *key,StackConstIter *begin,StackConstIter *end)

{
  bool bVar1;
  pointer pcVar2;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_true>
  local_40;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_true>
  local_38;
  const_iterator i;
  StackConstIter it;
  StackConstIter *end_local;
  StackConstIter *begin_local;
  string *key_local;
  
  std::reverse_iterator<std::_List_const_iterator<cmDefinitions>_>::reverse_iterator
            ((reverse_iterator<std::_List_const_iterator<cmDefinitions>_> *)&i,begin);
  while( true ) {
    bVar1 = std::operator!=((reverse_iterator<std::_List_const_iterator<cmDefinitions>_> *)&i,end);
    if (!bVar1) {
      return false;
    }
    pcVar2 = std::reverse_iterator<std::_List_const_iterator<cmDefinitions>_>::operator->
                       ((reverse_iterator<std::_List_const_iterator<cmDefinitions>_> *)&i);
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>_>_>
         ::find(&pcVar2->Map,key);
    pcVar2 = std::reverse_iterator<std::_List_const_iterator<cmDefinitions>_>::operator->
                       ((reverse_iterator<std::_List_const_iterator<cmDefinitions>_> *)&i);
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>_>_>
         ::end(&pcVar2->Map);
    bVar1 = std::__detail::operator!=(&local_38,&local_40);
    if (bVar1) break;
    std::reverse_iterator<std::_List_const_iterator<cmDefinitions>_>::operator++
              ((reverse_iterator<std::_List_const_iterator<cmDefinitions>_> *)&i);
  }
  return true;
}

Assistant:

bool cmDefinitions::HasKey(const std::string& key,
                           StackConstIter begin, StackConstIter end)
{
  for (StackConstIter it = begin; it != end; ++it)
    {
    MapType::const_iterator i = it->Map.find(key);
    if (i != it->Map.end())
      {
      return true;
      }
    }
  return false;
}